

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::Statement(SQCompiler *this,bool closeframe)

{
  SQUnsignedInteger *pSVar1;
  long lVar2;
  long n;
  SQTable *this_00;
  bool bVar3;
  SQUnsignedInteger SVar4;
  SQInteger arg2;
  SQInteger arg1;
  SQInteger SVar5;
  SQOpcode _op;
  sqvector<long_long> *this_01;
  SQFuncState *pSVar6;
  SQObject SVar7;
  SQObject SVar8;
  SQScope __oldscope__;
  SQObjectPtr local_38;
  
  SQFuncState::AddLineInfos(this->_fs,(this->_lex)._currentline,this->_lineinfo,false);
  lVar2 = this->_token;
  switch(lVar2) {
  case 0x10c:
    SwitchStatement(this);
    break;
  case 0x10d:
  case 0x10e:
  case 0x10f:
  case 0x111:
  case 0x116:
  case 0x118:
  case 0x119:
  case 0x11a:
  case 0x11c:
  case 0x11f:
  case 0x120:
  case 0x121:
  case 0x122:
  case 0x126:
switchD_00118199_caseD_10d:
    CommaExpr(this);
    SQFuncState::DiscardTarget(this->_fs);
    break;
  case 0x110:
    IfStatement(this);
    break;
  case 0x112:
    WhileStatement(this);
    break;
  case 0x113:
    pSVar6 = this->_fs;
    SVar4 = (pSVar6->_breaktargets)._size;
    if (SVar4 == 0) {
      Error(this,"\'break\' has to be in a loop block");
      pSVar6 = this->_fs;
      SVar4 = (pSVar6->_breaktargets)._size;
    }
    SVar5 = (pSVar6->_breaktargets)._vals[SVar4 - 1];
    if (0 < SVar5) {
      SQFuncState::AddInstruction(pSVar6,_OP_POPTRAP,SVar5,0,0,0);
      pSVar6 = this->_fs;
    }
    SVar5 = SQFuncState::GetStackSize(pSVar6);
    lVar2 = (this->_scope).stacksize;
    if ((SVar5 != lVar2) && (SVar5 = SQFuncState::CountOuters(this->_fs,lVar2), SVar5 != 0)) {
      SQFuncState::AddInstruction(this->_fs,_OP_CLOSE,0,(this->_scope).stacksize,0,0);
    }
    SQFuncState::AddInstruction(this->_fs,_OP_JMP,0,-0x4d2,0,0);
    SVar4 = (this->_fs->_instructions)._size;
    this_01 = &this->_fs->_unresolvedbreaks;
    goto LAB_00118413;
  case 0x114:
    ForStatement(this);
    break;
  case 0x115:
    DoWhileStatement(this);
    break;
  case 0x117:
    ForEachStatement(this);
    break;
  case 0x11b:
    LocalDeclStatement(this);
    break;
  case 0x11d:
    FunctionStatement(this);
    break;
  case 0x11e:
  case 0x124:
    if (lVar2 == 0x11e) {
      _op = _OP_RETURN;
    }
    else {
      this->_fs->_bgenerator = true;
      _op = _OP_YIELD;
    }
    Lex(this);
    bVar3 = IsEndOfStatement(this);
    pSVar6 = this->_fs;
    if (bVar3) {
      if ((lVar2 == 0x11e) && (0 < pSVar6->_traps)) {
        SQFuncState::AddInstruction(pSVar6,_OP_POPTRAP,pSVar6->_traps,0,0,0);
        pSVar6 = this->_fs;
      }
      pSVar6->_returnexp = -1;
      arg2 = SQFuncState::GetStackSize(pSVar6);
      SVar5 = 0xff;
      arg1 = 0;
    }
    else {
      SVar4 = (pSVar6->_instructions)._size;
      CommaExpr(this);
      pSVar6 = this->_fs;
      if ((lVar2 == 0x11e) && (0 < pSVar6->_traps)) {
        SQFuncState::AddInstruction(pSVar6,_OP_POPTRAP,pSVar6->_traps,0,0,0);
        pSVar6 = this->_fs;
      }
      pSVar6->_returnexp = SVar4;
      arg1 = SQFuncState::PopTarget(pSVar6);
      arg2 = SQFuncState::GetStackSize(this->_fs);
      SVar5 = 1;
    }
    goto LAB_001184fb;
  case 0x123:
    pSVar6 = this->_fs;
    SVar4 = (pSVar6->_continuetargets)._size;
    if (SVar4 == 0) {
      Error(this,"\'continue\' has to be in a loop block");
      pSVar6 = this->_fs;
      SVar4 = (pSVar6->_continuetargets)._size;
    }
    SVar5 = (pSVar6->_continuetargets)._vals[SVar4 - 1];
    if (0 < SVar5) {
      SQFuncState::AddInstruction(pSVar6,_OP_POPTRAP,SVar5,0,0,0);
      pSVar6 = this->_fs;
    }
    SVar5 = SQFuncState::GetStackSize(pSVar6);
    lVar2 = (this->_scope).stacksize;
    if ((SVar5 != lVar2) && (SVar5 = SQFuncState::CountOuters(this->_fs,lVar2), SVar5 != 0)) {
      SQFuncState::AddInstruction(this->_fs,_OP_CLOSE,0,(this->_scope).stacksize,0,0);
    }
    SQFuncState::AddInstruction(this->_fs,_OP_JMP,0,-0x4d2,0,0);
    SVar4 = (this->_fs->_instructions)._size;
    this_01 = &this->_fs->_unresolvedcontinues;
LAB_00118413:
    __oldscope__.outers = SVar4 - 1;
    sqvector<long_long>::push_back(this_01,&__oldscope__.outers);
LAB_00118421:
    Lex(this);
    break;
  case 0x125:
    TryCatchStatement(this);
    break;
  case 0x127:
    Lex(this);
    CommaExpr(this);
    pSVar6 = this->_fs;
    SVar5 = SQFuncState::PopTarget(pSVar6);
    _op = _OP_THROW;
    arg1 = 0;
    arg2 = 0;
LAB_001184fb:
    SQFuncState::AddInstruction(pSVar6,_op,SVar5,arg1,arg2,0);
    break;
  default:
    if (lVar2 == 0x144) {
      Lex(this);
      SVar7 = Expect(this,0x102);
      Expect(this,0x3d);
      SVar8 = ExpectScalar(this);
      OptionalSemicolon(this);
      this_00 = (this->_vm->_sharedstate->_consts).super_SQObject._unVal.pTable;
      __oldscope__.outers = CONCAT44(__oldscope__.outers._4_4_,SVar7._type);
      if ((SVar7._type >> 0x1b & 1) != 0) {
        pSVar1 = &((SVar7._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                  _uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((SVar8._type >> 0x1b & 1) != 0) {
        pSVar1 = &((SVar8._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                  _uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      __oldscope__.stacksize = SVar7._unVal.nInteger;
      local_38.super_SQObject._type = SVar8._type;
      local_38.super_SQObject._unVal.nInteger = SVar8._unVal.nInteger;
      SQTable::NewSlot(this_00,(SQObjectPtr *)&__oldscope__,&local_38);
      SQObjectPtr::~SQObjectPtr(&local_38);
      SQObjectPtr::Null((SQObjectPtr *)&__oldscope__);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&__oldscope__);
      break;
    }
    if (lVar2 == 0x7b) {
      __oldscope__.outers = (this->_scope).outers;
      __oldscope__.stacksize = (this->_scope).stacksize;
      pSVar6 = this->_fs;
      (this->_scope).outers = pSVar6->_outers;
      SVar5 = SQFuncState::GetStackSize(pSVar6);
      (this->_scope).stacksize = SVar5;
      Lex(this);
      Statements(this);
      Expect(this,0x7d);
      pSVar6 = this->_fs;
      if (closeframe) {
        lVar2 = pSVar6->_outers;
        SVar5 = SQFuncState::GetStackSize(pSVar6);
        n = (this->_scope).stacksize;
        if (SVar5 != n) {
          SQFuncState::SetStackSize(this->_fs,n);
          if (lVar2 != this->_fs->_outers) {
            SQFuncState::AddInstruction(this->_fs,_OP_CLOSE,0,(this->_scope).stacksize,0,0);
          }
        }
      }
      else {
        SVar5 = SQFuncState::GetStackSize(pSVar6);
        lVar2 = (this->_scope).stacksize;
        if (SVar5 != lVar2) {
          SQFuncState::SetStackSize(this->_fs,lVar2);
        }
      }
      (this->_scope).outers = __oldscope__.outers;
      (this->_scope).stacksize = __oldscope__.stacksize;
      break;
    }
    if (lVar2 == 0x133) {
      ClassStatement(this);
      break;
    }
    if (lVar2 == 0x143) {
      EnumStatement(this);
      break;
    }
    if (lVar2 != 0x3b) goto switchD_00118199_caseD_10d;
    goto LAB_00118421;
  }
  this->_fs->_optimization = false;
  return;
}

Assistant:

void Statement(bool closeframe = true)
    {
        _fs->AddLineInfos(_lex._currentline, _lineinfo);
        switch(_token){
        case _SC(';'):  Lex();                  break;
        case TK_IF:     IfStatement();          break;
        case TK_WHILE:      WhileStatement();       break;
        case TK_DO:     DoWhileStatement();     break;
        case TK_FOR:        ForStatement();         break;
        case TK_FOREACH:    ForEachStatement();     break;
        case TK_SWITCH: SwitchStatement();      break;
        case TK_LOCAL:      LocalDeclStatement();   break;
        case TK_RETURN:
        case TK_YIELD: {
            SQOpcode op;
            if(_token == TK_RETURN) {
                op = _OP_RETURN;
            }
            else {
                op = _OP_YIELD;
                _fs->_bgenerator = true;
            }
            Lex();
            if(!IsEndOfStatement()) {
                SQInteger retexp = _fs->GetCurrentPos()+1;
                CommaExpr();
                if(op == _OP_RETURN && _fs->_traps > 0)
                    _fs->AddInstruction(_OP_POPTRAP, _fs->_traps, 0);
                _fs->_returnexp = retexp;
                _fs->AddInstruction(op, 1, _fs->PopTarget(),_fs->GetStackSize());
            }
            else{
                if(op == _OP_RETURN && _fs->_traps > 0)
                    _fs->AddInstruction(_OP_POPTRAP, _fs->_traps ,0);
                _fs->_returnexp = -1;
                _fs->AddInstruction(op, 0xFF,0,_fs->GetStackSize());
            }
            break;}
        case TK_BREAK:
            if(_fs->_breaktargets.size() <= 0)Error(_SC("'break' has to be in a loop block"));
            if(_fs->_breaktargets.top() > 0){
                _fs->AddInstruction(_OP_POPTRAP, _fs->_breaktargets.top(), 0);
            }
            RESOLVE_OUTERS();
            _fs->AddInstruction(_OP_JMP, 0, -1234);
            _fs->_unresolvedbreaks.push_back(_fs->GetCurrentPos());
            Lex();
            break;
        case TK_CONTINUE:
            if(_fs->_continuetargets.size() <= 0)Error(_SC("'continue' has to be in a loop block"));
            if(_fs->_continuetargets.top() > 0) {
                _fs->AddInstruction(_OP_POPTRAP, _fs->_continuetargets.top(), 0);
            }
            RESOLVE_OUTERS();
            _fs->AddInstruction(_OP_JMP, 0, -1234);
            _fs->_unresolvedcontinues.push_back(_fs->GetCurrentPos());
            Lex();
            break;
        case TK_FUNCTION:
            FunctionStatement();
            break;
        case TK_CLASS:
            ClassStatement();
            break;
        case TK_ENUM:
            EnumStatement();
            break;
        case _SC('{'):{
                BEGIN_SCOPE();
                Lex();
                Statements();
                Expect(_SC('}'));
                if(closeframe) {
                    END_SCOPE();
                }
                else {
                    END_SCOPE_NO_CLOSE();
                }
            }
            break;
        case TK_TRY:
            TryCatchStatement();
            break;
        case TK_THROW:
            Lex();
            CommaExpr();
            _fs->AddInstruction(_OP_THROW, _fs->PopTarget());
            break;
        case TK_CONST:
            {
            Lex();
            SQObject id = Expect(TK_IDENTIFIER);
            Expect('=');
            SQObject val = ExpectScalar();
            OptionalSemicolon();
            SQTable *enums = _table(_ss(_vm)->_consts);
            SQObjectPtr strongid = id;
            enums->NewSlot(strongid,SQObjectPtr(val));
            strongid.Null();
            }
            break;
        default:
            CommaExpr();
            _fs->DiscardTarget();
            //_fs->PopTarget();
            break;
        }
        _fs->SnoozeOpt();
    }